

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O2

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::add_packed_fixed<long,long*>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,long *first,long *last)

{
  if (first != last) {
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::add_length_varint((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this,tag,(uint)((long)last - (long)first) & 0xfffffff8);
    basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::reserve((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,(long)last - (long)first);
    for (; first != last; first = first + 1) {
      basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::add_fixed<long>((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this,*first);
    }
  }
  return;
}

Assistant:

void add_packed_fixed(pbf_tag_type tag, It first, It last, std::forward_iterator_tag /*unused*/) { // NOLINT(performance-unnecessary-value-param)
        if (first == last) {
            return;
        }

        const auto length = std::distance(first, last);
        add_length_varint(tag, sizeof(T) * pbf_length_type(length));
        reserve(sizeof(T) * std::size_t(length));

        while (first != last) {
            add_fixed<T>(*first++);
        }
    }